

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  IArgFunction<Catch::ConfigData> *pIVar4;
  CommandLine<Catch::ConfigData> *in_RDI;
  ArgBinder binder;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 local_120 [40];
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  int local_98;
  value_type local_90;
  value_type local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pIVar4 = (IArgFunction<Catch::ConfigData> *)operator_new(8);
  pIVar4->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_0016c410;
  (in_RDI->m_boundProcessName).functionObj = pIVar4;
  (in_RDI->m_options).
  super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->m_options).
  super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->m_options).
  super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  in_RDI->m_highestSpecifiedArgPosition = 0;
  (in_RDI->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->m_arg)._M_ptr = (Arg *)0x0;
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<std::__cxx11::string_Catch::ConfigData::*>
            (in_RDI,0x78);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c4d0;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction = (_func_int **)0x6
  ;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"display usage information","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"?","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  paVar3 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"h","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_70);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"help","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c4d0;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction = (_func_int **)0x0
  ;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"list all (or matching) test cases","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"l","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"list-tests","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c4d0;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction = (_func_int **)0x1
  ;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"list all (or matching) tags","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"t","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"list-tags","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c4d0;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction = (_func_int **)0x2
  ;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"list all reporters","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"list-reporters","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c4d0;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction = (_func_int **)0x3
  ;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"include successful tests in output","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"s","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"success","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c4d0;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction = (_func_int **)0x4
  ;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"break into debugger on failure","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"b","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"break","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c4d0;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction = (_func_int **)0x5
  ;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"skip exception tests","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"e","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"nothrow","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c478;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction =
       (_func_int **)0x38;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"output filename","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"o","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"filename","");
  std::__cxx11::string::_M_assign((string *)&local_b8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c478;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction =
       (_func_int **)0x18;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"reporter to use - defaults to console","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"r","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"reporter","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"name","");
  std::__cxx11::string::_M_assign((string *)&local_b8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c478;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction =
       (_func_int **)0x58;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"suite name","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"n","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"name","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"name","");
  std::__cxx11::string::_M_assign((string *)&local_b8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c528;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction =
       (_func_int **)abortAfterFirst;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"abort at first failure","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"a","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"abort","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c580;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction =
       (_func_int **)abortAfterX;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"abort after x failures","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"x","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"abortx","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"number of failures","");
  std::__cxx11::string::_M_assign((string *)&local_b8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c5d8;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction =
       (_func_int **)addWarning;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"enable warnings","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"w","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"warn","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"warning name","");
  std::__cxx11::string::_M_assign((string *)&local_b8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c5d8;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction =
       (_func_int **)addTestOrTags;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"which test or tests to use","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"test name, pattern or tags","");
  std::__cxx11::string::_M_assign((string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  local_120._8_8_ = operator_new(0x10);
  ((IArgFunction<Catch::ConfigData> *)local_120._8_8_)->_vptr_IArgFunction =
       (_func_int **)&PTR__IArgFunction_0016c630;
  ((IArgFunction<Catch::ConfigData> *)(local_120._8_8_ + 8))->_vptr_IArgFunction =
       (_func_int **)setShowDurations;
  local_120._16_8_ = (pointer)0x0;
  local_120._24_8_ = (pointer)0x0;
  local_120._32_8_ = (pointer)0x0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = -1;
  local_140[0] = local_130;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"show test durations","");
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"d","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 0x10),&local_90);
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"durations","");
  std::__cxx11::string::_M_assign((string *)&local_f8);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"yes/no","");
  std::__cxx11::string::_M_assign((string *)&local_b8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0]);
  }
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder((ArgBinder *)local_120);
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

        Clara::CommandLine<ConfigData> cli;

        cli.bindProcessName( &ConfigData::processName );

        cli.bind( &ConfigData::showHelp )
            .describe( "display usage information" )
            .shortOpt( "?")
            .shortOpt( "h")
            .longOpt( "help" );

        cli.bind( &ConfigData::listTests )
            .describe( "list all (or matching) test cases" )
            .shortOpt( "l")
            .longOpt( "list-tests" );

        cli.bind( &ConfigData::listTags )
            .describe( "list all (or matching) tags" )
            .shortOpt( "t")
            .longOpt( "list-tags" );

        cli.bind( &ConfigData::listReporters )
            .describe( "list all reporters" )
            .longOpt( "list-reporters" );

        cli.bind( &ConfigData::showSuccessfulTests )
            .describe( "include successful tests in output" )
            .shortOpt( "s")
            .longOpt( "success" );

        cli.bind( &ConfigData::shouldDebugBreak )
            .describe( "break into debugger on failure" )
            .shortOpt( "b")
            .longOpt( "break" );

        cli.bind( &ConfigData::noThrow )
            .describe( "skip exception tests" )
            .shortOpt( "e")
            .longOpt( "nothrow" );

        cli.bind( &ConfigData::outputFilename )
            .describe( "output filename" )
            .shortOpt( "o")
            .longOpt( "out" )
            .hint( "filename" );

        cli.bind( &ConfigData::reporterName )
            .describe( "reporter to use - defaults to console" )
            .shortOpt( "r")
            .longOpt( "reporter" )
//            .hint( "name[:filename]" );
            .hint( "name" );

        cli.bind( &ConfigData::name )
            .describe( "suite name" )
            .shortOpt( "n")
            .longOpt( "name" )
            .hint( "name" );

        cli.bind( &abortAfterFirst )
            .describe( "abort at first failure" )
            .shortOpt( "a")
            .longOpt( "abort" );

        cli.bind( &abortAfterX )
            .describe( "abort after x failures" )
            .shortOpt( "x")
            .longOpt( "abortx" )
            .hint( "number of failures" );

        cli.bind( &addWarning )
            .describe( "enable warnings" )
            .shortOpt( "w")
            .longOpt( "warn" )
            .hint( "warning name" );

//        cli.bind( &setVerbosity )
//            .describe( "level of verbosity (0=no output)" )
//            .shortOpt( "v")
//            .longOpt( "verbosity" )
//            .hint( "level" );

        cli.bind( &addTestOrTags )
            .describe( "which test or tests to use" )
            .hint( "test name, pattern or tags" );

        cli.bind( &setShowDurations )
            .describe( "show test durations" )
            .shortOpt( "d")
            .longOpt( "durations" )
            .hint( "yes/no" );

        return cli;
    }